

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processLogAndErrorCommand(CommonCore *this,ActionMessage *cmd)

{
  string_view message;
  string_view message_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  BrokerState BVar2;
  BrokerState BVar3;
  action_t aVar4;
  GlobalFederateId *this_00;
  pointer pBVar5;
  FedInfo *pFVar6;
  ActionMessage *in_RSI;
  long *in_RDI;
  __sv_type _Var7;
  string_view sVar8;
  int in_stack_00000014;
  BrokerBase *in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  bool in_stack_0000004f;
  CommonCore *in_stack_00000050;
  ActionMessage *in_stack_00000078;
  CommonCore *in_stack_00000080;
  char *in_stack_00000088;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed_1;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  ActionMessage *in_stack_00000378;
  FilterFederate *in_stack_00000380;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
  *in_stack_fffffffffffffdd8;
  ActionMessage *action;
  CommonCore *in_stack_fffffffffffffde0;
  FederateState *this_01;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  CommonCore *this_02;
  undefined4 in_stack_fffffffffffffe18;
  GlobalFederateId in_stack_fffffffffffffe1c;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_fffffffffffffe20;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_168;
  undefined4 local_14c;
  undefined4 local_148;
  GlobalFederateId in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  GlobalFederateId in_stack_fffffffffffffec4;
  string_view in_stack_fffffffffffffec8;
  GlobalFederateId local_11c;
  BaseType local_118;
  GlobalFederateId local_114;
  string_view local_110;
  BaseType local_fc;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_e0;
  undefined1 in_stack_ffffffffffffff38 [16];
  undefined1 auVar9 [13];
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  BaseType BVar10;
  char *in_stack_ffffffffffffff50;
  char *pcVar11;
  GlobalFederateId in_stack_ffffffffffffff5c;
  GlobalFederateId federateID;
  GlobalFederateId local_9c;
  string_view local_98;
  string_view local_88;
  undefined4 local_78;
  undefined4 local_74;
  BaseType local_70;
  BaseType local_6c;
  string_view local_68;
  __sv_type local_58;
  BaseType local_48;
  BaseType local_44;
  string_view local_40;
  __sv_type local_30;
  undefined4 local_1c;
  GlobalFederateId local_18;
  BaseType local_14;
  ActionMessage *local_10;
  
  auVar9 = in_stack_ffffffffffffff38._3_13_;
  local_10 = in_RSI;
  aVar4 = ActionMessage::action(in_RSI);
  if ((aVar4 == cmd_log) || (aVar4 == cmd_remote_log)) {
    local_14 = *(BaseType *)((long)in_RDI + 0x14);
    bVar1 = GlobalFederateId::operator==(&local_10->dest_id,(GlobalBrokerId)local_14);
    if (!bVar1) {
      routeMessage(in_stack_00000080,in_stack_00000078);
      return;
    }
    local_1c = 0;
    GlobalFederateId::GlobalFederateId(&local_18,(GlobalBrokerId)0x0);
    ActionMessage::getString_abi_cxx11_
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    local_30 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffde0);
    local_40 = SmallBuffer::to_string((SmallBuffer *)0x5507f8);
    ActionMessage::action(local_10);
    name._M_len._4_4_ = in_stack_ffffffffffffff4c;
    name._M_len._0_4_ = in_stack_ffffffffffffff48;
    name._M_str = in_stack_ffffffffffffff50;
    sVar8._M_str = in_stack_00000088;
    sVar8._M_len = (size_t)in_stack_00000080;
    BrokerBase::sendToLogger
              (auVar9._5_8_,in_stack_ffffffffffffff5c,auVar9._1_4_,name,sVar8,auVar9[0]);
    return;
  }
  if (aVar4 == cmd_warning) {
    local_44 = *(BaseType *)((long)in_RDI + 0x14);
    bVar1 = GlobalFederateId::operator==(&local_10->dest_id,(GlobalBrokerId)local_44);
    if (!bVar1) {
      routeMessage(in_stack_00000080,in_stack_00000078);
      return;
    }
    local_48 = (local_10->source_id).gid;
    ActionMessage::getString_abi_cxx11_
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffde0);
    local_68 = SmallBuffer::to_string((SmallBuffer *)0x5508fa);
    name_00._M_len._4_4_ = in_stack_ffffffffffffff4c;
    name_00._M_len._0_4_ = in_stack_ffffffffffffff48;
    name_00._M_str = in_stack_ffffffffffffff50;
    message._M_str = in_stack_00000088;
    message._M_len = (size_t)in_stack_00000080;
    BrokerBase::sendToLogger
              (auVar9._5_8_,in_stack_ffffffffffffff5c,auVar9._1_4_,name_00,message,auVar9[0]);
    return;
  }
  if ((aVar4 != cmd_error) && (aVar4 != cmd_local_error)) {
    if (aVar4 != cmd_global_error) {
      return;
    }
    BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x55100f);
    if (BVar3 == CONNECTING) {
      processDisconnect(in_stack_00000050,in_stack_0000004f);
    }
    SmallBuffer::to_string((SmallBuffer *)0x55104f);
    BrokerBase::setErrorState(in_stack_00000018,in_stack_00000014,(string_view)in_stack_00000020);
    bVar1 = isConnected(in_stack_fffffffffffffde0);
    if (!bVar1) {
      return;
    }
    SmallBuffer::to_string((SmallBuffer *)0x5510b0);
    sendErrorToFederates
              ((CommonCore *)CONCAT44(in_stack_fffffffffffffec4.gid,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffebc.gid,in_stack_fffffffffffffec8);
    bVar1 = GlobalFederateId::operator==(&local_10->source_id,(GlobalBrokerId)(BaseType)in_RDI[3]);
    if (bVar1) {
      return;
    }
    bVar1 = GlobalFederateId::operator==(&local_10->source_id,(GlobalBrokerId)0x1);
    if (bVar1) {
      return;
    }
    (**(code **)(*in_RDI + 0x360))(in_RDI,0,local_10);
    return;
  }
  local_6c = *(BaseType *)((long)in_RDI + 0x14);
  bVar1 = GlobalFederateId::operator==(&local_10->dest_id,(GlobalBrokerId)local_6c);
  if (!bVar1) {
    bVar1 = GlobalFederateId::operator==(&local_10->dest_id,(GlobalBrokerId)0x0);
    if (bVar1) {
      if ((*(byte *)((long)in_RDI + 0xda) & 1) != 0) {
        BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x550e55);
        BVar2 = (BrokerState)((ulong)in_stack_fffffffffffffde0 >> 0x30);
        if (BVar3 != ERRORED) {
          sVar8 = SmallBuffer::to_string((SmallBuffer *)0x550e7b);
          sendErrorToFederates
                    ((CommonCore *)CONCAT44(in_stack_fffffffffffffec4.gid,in_stack_fffffffffffffec0)
                     ,in_stack_fffffffffffffebc.gid,(string_view)sVar8);
          BrokerBase::setBrokerState
                    ((BrokerBase *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                     BVar2);
        }
        ActionMessage::setAction(local_10,cmd_global_error);
        GlobalFederateId::GlobalFederateId
                  ((GlobalFederateId *)&stack0xfffffffffffffec4,
                   (GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
        (local_10->source_id).gid = in_stack_fffffffffffffec4.gid;
        local_148 = 1;
        GlobalFederateId::GlobalFederateId
                  ((GlobalFederateId *)&stack0xfffffffffffffebc,(GlobalBrokerId)0x1);
        (local_10->dest_id).gid = in_stack_fffffffffffffebc.gid;
        local_14c = 0;
        (**(code **)(*in_RDI + 0x360))(in_RDI,0,local_10);
        return;
      }
      bVar1 = GlobalFederateId::isValid(&local_10->source_id);
      if (bVar1) {
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
        ::find(in_stack_fffffffffffffe20,
               (GlobalFederateId *)CONCAT44(in_stack_fffffffffffffe1c.gid,in_stack_fffffffffffffe18)
              );
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
        ::end((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
               *)in_stack_fffffffffffffde0);
        bVar1 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator!=
                          ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)
                           in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        if (bVar1) {
          pFVar6 = gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::
                   operator->(&local_168);
          pFVar6->state = ERROR_STATE;
        }
      }
    }
    routeMessage(in_stack_00000080,in_stack_00000078);
    return;
  }
  local_70 = (BaseType)in_RDI[3];
  bVar1 = GlobalFederateId::operator==(&local_10->source_id,(GlobalBrokerId)local_70);
  if (!bVar1) {
    local_74 = 0;
    bVar1 = GlobalFederateId::operator==(&local_10->source_id,(GlobalBrokerId)0x0);
    if (!bVar1) {
      local_78 = 1;
      bVar1 = GlobalFederateId::operator==(&local_10->source_id,(GlobalBrokerId)0x1);
      if (!bVar1) {
        this_02 = (CommonCore *)(in_RDI + 1);
        GlobalFederateId::GlobalFederateId(&local_9c,(GlobalBrokerId)0x0);
        BVar10 = (local_10->source_id).gid;
        getFederateNameNoThrow_abi_cxx11_(this_02,in_stack_fffffffffffffe1c);
        _Var7 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffde0);
        pcVar11 = (char *)_Var7._M_len;
        federateID.gid = _Var7._M_str._4_4_;
        sVar8 = SmallBuffer::to_string((SmallBuffer *)0x550b40);
        action = (ActionMessage *)sVar8._M_len;
        this_01 = (FederateState *)sVar8._M_str;
        name_01._M_len._4_4_ = BVar10;
        name_01._M_len._0_4_ = in_stack_ffffffffffffff48;
        name_01._M_str = pcVar11;
        message_00._M_str = in_stack_00000088;
        message_00._M_len = (size_t)in_stack_00000080;
        BrokerBase::sendToLogger
                  ((BrokerBase *)this_01,federateID,sVar8._M_len._4_4_,name_01,message_00,
                   sVar8._M_len._3_1_);
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
        ::find(in_stack_fffffffffffffe20,
               (GlobalFederateId *)CONCAT44(in_stack_fffffffffffffe1c.gid,in_stack_fffffffffffffe18)
              );
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
        ::end((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
               *)this_01);
        bVar1 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator!=
                          ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)this_01,
                           (BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
                            *)action);
        if (bVar1) {
          bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                            (local_10,indicator_flag);
          if (bVar1) {
            gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator->
                      (&local_e0);
            FederateState::addAction(this_01,action);
            BVar3 = (BrokerState)((ulong)this_01 >> 0x30);
          }
          else {
            pFVar6 = gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::
                     operator->(&local_e0);
            BVar3 = (BrokerState)((ulong)this_01 >> 0x30);
            pFVar6->state = ERROR_STATE;
          }
        }
        else {
          this_00 = &local_10->source_id;
          local_fc = (BaseType)
                     std::atomic::operator_cast_to_GlobalFederateId
                               ((atomic<helics::GlobalFederateId> *)action);
          BVar3 = (BrokerState)((ulong)this_01 >> 0x30);
          bVar1 = GlobalFederateId::operator==(this_00,(GlobalFederateId)local_fc);
          if (bVar1) {
            FilterFederate::handleMessage(in_stack_00000380,in_stack_00000378);
          }
        }
        if ((*(byte *)((long)in_RDI + 0x211) & 1) != 0) {
          pBVar5 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x550cb0);
          (*pBVar5->_vptr_BaseTimeCoordinator[3])(pBVar5,local_10);
        }
        goto LAB_00550cc3;
      }
    }
  }
  BVar3 = (BrokerState)((ulong)in_stack_fffffffffffffde0 >> 0x30);
  local_88 = SmallBuffer::to_string((SmallBuffer *)0x550a36);
  sendErrorToFederates
            ((CommonCore *)CONCAT44(in_stack_fffffffffffffec4.gid,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffebc.gid,in_stack_fffffffffffffec8);
  local_98 = SmallBuffer::to_string((SmallBuffer *)0x550a92);
  BrokerBase::setErrorState(in_stack_00000018,in_stack_00000014,(string_view)in_stack_00000020);
LAB_00550cc3:
  if ((*(byte *)((long)in_RDI + 0xda) & 1) != 0) {
    BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x550ce3);
    if ((BVar2 != ERRORED) &&
       (BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x550cf7), BVar2 != CONNECTED_ERROR)) {
      local_110 = SmallBuffer::to_string((SmallBuffer *)0x550d1d);
      sendErrorToFederates
                ((CommonCore *)CONCAT44(in_stack_fffffffffffffec4.gid,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc.gid,in_stack_fffffffffffffec8);
      BrokerBase::setBrokerState
                ((BrokerBase *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),BVar3);
    }
    ActionMessage::setAction(local_10,cmd_global_error);
    local_118 = *(BaseType *)((long)in_RDI + 0x14);
    GlobalFederateId::GlobalFederateId(&local_114,(GlobalBrokerId)local_118);
    (local_10->source_id).gid = local_114.gid;
    GlobalFederateId::GlobalFederateId(&local_11c,(GlobalBrokerId)0x1);
    (local_10->dest_id).gid = local_11c.gid;
    (**(code **)(*in_RDI + 0x360))(in_RDI,0,local_10);
  }
  return;
}

Assistant:

void CommonCore::processLogAndErrorCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_LOG:
        case CMD_REMOTE_LOG:
            if (cmd.dest_id == global_broker_id_local) {
                sendToLogger(parent_broker_id,
                             cmd.messageID,
                             cmd.getString(0),
                             cmd.payload.to_string(),
                             cmd.action() == CMD_REMOTE_LOG);
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_WARNING:
            if (cmd.dest_id == global_broker_id_local) {
                sendToLogger(cmd.source_id,
                             LogLevels::WARNING,
                             cmd.getString(0),
                             cmd.payload.to_string());
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
            if (cmd.dest_id == global_broker_id_local) {
                if (cmd.source_id == higher_broker_id || cmd.source_id == parent_broker_id ||
                    cmd.source_id == gRootBrokerID) {
                    sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                    setErrorState(cmd.messageID, cmd.payload.to_string());

                } else {
                    sendToLogger(parent_broker_id,
                                 LogLevels::ERROR_LEVEL,
                                 getFederateNameNoThrow(cmd.source_id),
                                 cmd.payload.to_string());
                    auto fed = loopFederates.find(cmd.source_id);
                    if (fed != loopFederates.end()) {
                        if (checkActionFlag(cmd, indicator_flag)) {
                            fed->fed->addAction(cmd);
                        } else {
                            fed->state = OperatingState::ERROR_STATE;
                        }

                    } else if (cmd.source_id == filterFedID) {
                        filterFed->handleMessage(cmd);
                        // filterFed->
                    }

                    if (hasTimeDependency) {
                        timeCoord->processTimeMessage(cmd);
                    }
                }
                if (terminate_on_error) {
                    if (getBrokerState() != BrokerState::ERRORED &&
                        getBrokerState() != BrokerState::CONNECTED_ERROR) {
                        sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                        setBrokerState(BrokerState::ERRORED);
                    }
                    cmd.setAction(CMD_GLOBAL_ERROR);
                    cmd.source_id = global_broker_id_local;
                    cmd.dest_id = gRootBrokerID;
                    transmit(parent_route_id, std::move(cmd));
                }
            } else {
                if (cmd.dest_id == parent_broker_id) {
                    if (terminate_on_error) {
                        if (getBrokerState() != BrokerState::ERRORED) {
                            sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                            setBrokerState(BrokerState::ERRORED);
                        }
                        cmd.setAction(CMD_GLOBAL_ERROR);
                        cmd.source_id = global_broker_id_local;
                        cmd.dest_id = gRootBrokerID;
                        transmit(parent_route_id, std::move(cmd));
                        break;
                    }
                    if (cmd.source_id.isValid()) {
                        auto fed = loopFederates.find(cmd.source_id);
                        if (fed != loopFederates.end()) {
                            fed->state = OperatingState::ERROR_STATE;
                        }
                    }
                }
                routeMessage(cmd);
            }
            break;
        case CMD_GLOBAL_ERROR:

            if (getBrokerState() == BrokerState::CONNECTING) {
                processDisconnect();
            }
            setErrorState(cmd.messageID, cmd.payload.to_string());
            if (isConnected()) {
                sendErrorToFederates(cmd.messageID, cmd.payload.to_string());
                if (!(cmd.source_id == higher_broker_id || cmd.source_id == gRootBrokerID)) {
                    transmit(parent_route_id, std::move(cmd));
                }
            }
            break;
        default:
            break;
    }
}